

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckd_alloc.c
# Opt level: O1

void ckd_free(void *ptr)

{
  free(ptr);
  return;
}

Assistant:

void
ckd_free(void *ptr)
{
#if defined(__ADSPBLACKFIN__) && !defined(__linux__)
    if (ptr)
        heap_free(0,ptr);
#else
    free(ptr);
#endif
}